

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool __thiscall
interpreter::Interpreter::checkEvalErrors
          (Interpreter *this,
          list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *eval_src)

{
  int iVar1;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar2;
  ostream *poVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  GCPtr<symbols::Object> eval;
  GCPtr<symbols::ErrorObject> err;
  GCPtr<symbols::Object> local_60;
  GCPtr<symbols::ErrorObject> local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  p_Var5 = (eval_src->
           super__List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var5 == (_List_node_base *)eval_src) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      local_60.addr = (Object *)p_Var5[1]._M_next;
      plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      do {
        plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 (plVar2->
                 super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
      } while ((ErrorObject *)((_List_node_base *)((long)plVar2 + 0x10))->_M_prev !=
               (ErrorObject *)local_60.addr);
      *(int *)((long)plVar2 + 0x10U) = *(int *)((long)plVar2 + 0x10U) + 1;
      iVar1 = (*(code *)((_List_node_base *)
                        (((ErrorObject *)local_60.addr)->super_Object)._vptr_Object)->_M_next)();
      if (iVar1 == 4) {
        GCPtr<symbols::ErrorObject>::GCPtr(&local_58,(ErrorObject *)local_60.addr);
        (*((local_58.addr)->super_Object)._vptr_Object[3])(&local_50);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_50,local_48);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        GCPtr<symbols::ErrorObject>::~GCPtr(&local_58);
        bVar4 = true;
      }
      GCPtr<symbols::Object>::~GCPtr(&local_60);
      p_Var5 = (((_List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)eval_src);
  }
  return bVar4;
}

Assistant:

bool  interpreter::Interpreter::checkEvalErrors(list<GCPtr<Object>> eval_src)
{
    bool hasErrors = false;
    for(auto eval : eval_src){
        if(eval->type() == Types::ERRORTYPE){
            GCPtr<ErrorObject> err = static_cast<ErrorObject*>(eval.raw());
            cout << err->toString() << endl;
            hasErrors = true;
        }
    }
    return hasErrors;
}